

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_predictive_coefficients_stability_check.cc
# Opt level: O1

bool __thiscall
sptk::LinearPredictiveCoefficientsStabilityCheck::Run
          (LinearPredictiveCoefficientsStabilityCheck *this,
          vector<double,_std::allocator<double>_> *linear_predictive_coefficients,
          vector<double,_std::allocator<double>_> *modified_linear_predictive_coefficients,
          bool *is_stable,Buffer *buffer)

{
  vector<double,_std::allocator<double>_> *parcor_coefficients;
  double dVar1;
  uint uVar2;
  pointer pdVar3;
  bool bVar4;
  long lVar5;
  size_type __new_size;
  ulong uVar6;
  double dVar7;
  
  if (this->is_valid_ != true) {
    return false;
  }
  if (buffer == (Buffer *)0x0) {
    return false;
  }
  if (is_stable == (bool *)0x0) {
    return false;
  }
  __new_size = (long)this->num_order_ + 1;
  if ((long)(linear_predictive_coefficients->super__Vector_base<double,_std::allocator<double>_>).
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(linear_predictive_coefficients->super__Vector_base<double,_std::allocator<double>_>).
            _M_impl.super__Vector_impl_data._M_start >> 3 != __new_size) {
    return false;
  }
  if ((modified_linear_predictive_coefficients != (vector<double,_std::allocator<double>_> *)0x0) &&
     ((long)(modified_linear_predictive_coefficients->
            super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)(modified_linear_predictive_coefficients->
            super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
            _M_start >> 3 != __new_size)) {
    std::vector<double,_std::allocator<double>_>::resize
              (modified_linear_predictive_coefficients,__new_size);
  }
  *is_stable = true;
  if (this->num_order_ == 0) {
    if (modified_linear_predictive_coefficients == (vector<double,_std::allocator<double>_> *)0x0) {
      return true;
    }
    *(modified_linear_predictive_coefficients->super__Vector_base<double,_std::allocator<double>_>).
     _M_impl.super__Vector_impl_data._M_start =
         *(linear_predictive_coefficients->super__Vector_base<double,_std::allocator<double>_>).
          _M_impl.super__Vector_impl_data._M_start;
    return true;
  }
  parcor_coefficients = &buffer->parcor_coefficients_;
  bVar4 = LinearPredictiveCoefficientsToParcorCoefficients::Run
                    (&this->linear_predictive_coefficients_to_parcor_coefficients_,
                     linear_predictive_coefficients,parcor_coefficients,is_stable,
                     &buffer->conversion_buffer_);
  if (bVar4) {
    if (modified_linear_predictive_coefficients != (vector<double,_std::allocator<double>_> *)0x0) {
      uVar2 = this->num_order_;
      if (0 < (int)uVar2) {
        pdVar3 = (parcor_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        dVar7 = 1.0 - this->margin_;
        lVar5 = 1;
        do {
          dVar1 = pdVar3[lVar5];
          if (dVar7 < ABS(dVar1)) {
            uVar6 = -(ulong)(0.0 < dVar1);
            pdVar3[lVar5] = (double)(~uVar6 & (ulong)-dVar7 | uVar6 & (ulong)dVar7);
          }
          lVar5 = lVar5 + 1;
        } while ((ulong)uVar2 + 1 != lVar5);
      }
      bVar4 = ParcorCoefficientsToLinearPredictiveCoefficients::Run
                        (&this->parcor_coefficients_to_linear_predictive_coefficients_,
                         parcor_coefficients,modified_linear_predictive_coefficients,
                         &buffer->reconversion_buffer_);
      if (!bVar4) goto LAB_00105521;
    }
    bVar4 = true;
  }
  else {
LAB_00105521:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool LinearPredictiveCoefficientsStabilityCheck::Run(
    const std::vector<double>& linear_predictive_coefficients,
    std::vector<double>* modified_linear_predictive_coefficients,
    bool* is_stable,
    LinearPredictiveCoefficientsStabilityCheck::Buffer* buffer) const {
  // Check inputs.
  if (!is_valid_ ||
      linear_predictive_coefficients.size() !=
          static_cast<std::size_t>(num_order_ + 1) ||
      NULL == is_stable || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (NULL != modified_linear_predictive_coefficients &&
      modified_linear_predictive_coefficients->size() !=
          static_cast<std::size_t>(num_order_ + 1)) {
    modified_linear_predictive_coefficients->resize(num_order_ + 1);
  }

  // Handle a special case.
  *is_stable = true;
  if (0 == num_order_) {
    if (NULL != modified_linear_predictive_coefficients) {
      (*modified_linear_predictive_coefficients)[0] =
          linear_predictive_coefficients[0];
    }
    return true;
  }

  // Check stability.
  if (!linear_predictive_coefficients_to_parcor_coefficients_.Run(
          linear_predictive_coefficients, &buffer->parcor_coefficients_,
          is_stable, &buffer->conversion_buffer_)) {
    return false;
  }

  // Perform modification.
  if (NULL != modified_linear_predictive_coefficients) {
    double* parcor_coefficients(&buffer->parcor_coefficients_[0]);
    const double bound(1.0 - margin_);
    for (int m(1); m <= num_order_; ++m) {
      if (bound < std::fabs(parcor_coefficients[m])) {
        parcor_coefficients[m] =
            (0.0 < parcor_coefficients[m]) ? bound : -bound;
      }
    }
    if (!parcor_coefficients_to_linear_predictive_coefficients_.Run(
            buffer->parcor_coefficients_,
            modified_linear_predictive_coefficients,
            &buffer->reconversion_buffer_)) {
      return false;
    }
  }

  return true;
}